

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::callFooWhenResolved
          (TestMoreStuffImpl *this,CallFooWhenResolvedContext context)

{
  PromiseArena *pPVar1;
  void *pvVar2;
  undefined8 uVar3;
  _func_int **pp_Var4;
  WirePointer *pWVar5;
  CapTableReader *pCVar6;
  OwnPromiseNode node;
  int iVar7;
  void *pvVar8;
  PromiseArena *in_RDX;
  TransformPromiseNodeBase *this_00;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  OwnPromiseNode intermediate;
  Reader params;
  undefined1 local_c0 [12];
  undefined4 uStack_b4;
  undefined8 uStack_b0;
  WirePointer *local_a8;
  PromiseArena *pPStack_a0;
  pointer_____offset_0x10___ *local_98;
  SegmentReader *local_90;
  CapTableReader *pCStack_88;
  OwnPromiseNode local_80;
  PointerReader local_78;
  StructReader local_58;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (*(code *)**(undefined8 **)in_RDX->bytes)(&local_78);
  local_a8 = local_78.pointer;
  pPStack_a0 = (PromiseArena *)local_78._24_8_;
  stack0xffffffffffffff48 = (pointer_____offset_0x10___ *)local_78.segment;
  uStack_b0 = local_78.capTable;
  PointerReader::getStruct(&local_58,(PointerReader *)(local_c0 + 8),(word *)0x0);
  bVar9 = local_58.pointerCount != 0;
  local_a8 = (WirePointer *)0x0;
  if (bVar9) {
    local_a8 = local_58.pointers;
  }
  iVar7 = 0x7fffffff;
  if (bVar9) {
    iVar7 = local_58.nestingLimit;
  }
  uVar10 = 0;
  uVar11 = 0;
  uVar12 = 0;
  uVar13 = 0;
  if (bVar9) {
    uVar10 = local_58.segment._0_4_;
    uVar11 = local_58.segment._4_4_;
    uVar12 = local_58.capTable._0_4_;
    uVar13 = local_58.capTable._4_4_;
  }
  stack0xffffffffffffff48 = (pointer_____offset_0x10___ *)CONCAT44(uVar11,uVar10);
  uStack_b0 = (CapTableReader *)CONCAT44(uVar13,uVar12);
  pPStack_a0 = (PromiseArena *)CONCAT44(pPStack_a0._4_4_,iVar7);
  PointerReader::getCapability(&local_78);
  local_90 = local_78.segment;
  pCStack_88 = local_78.capTable;
  local_98 = &Capability::Client::typeinfo;
  Capability::Client::whenResolved((Client *)local_c0);
  (**(code **)(**(long **)((long)&local_90 + (long)local_98[-3]) + 0x20))(&uStack_b0);
  uVar3 = local_c0._0_8_;
  stack0xffffffffffffff48 = &Capability::Client::typeinfo;
  pPVar1 = ((PromiseArenaMember *)local_c0._0_8_)->arena;
  pPStack_a0 = in_RDX;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_c0._0_8_ - (long)pPVar1) < 0x40) {
    pvVar8 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3c0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)local_c0,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++:1079:34)>
               ::anon_class_32_2_dc087ca5_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3c0) = &PTR_destroy_006be710;
    pvVar2 = ((ClientHook *)((long)stack0xffffffffffffff48 + -0x20))->brand;
    uVar3 = *(undefined8 *)((long)&uStack_b0 + (long)pvVar2);
    *(undefined8 *)((long)pvVar8 + 1000) = *(undefined8 *)(local_c0 + (long)pvVar2 + 8);
    *(undefined8 *)((long)pvVar8 + 0x3f0) = uVar3;
    *(undefined8 *)((long)&uStack_b0 + (long)pvVar2) = 0;
    *(pointer_____offset_0x10___ **)((long)pvVar8 + 0x3e0) = &Capability::Client::typeinfo;
    *(PromiseArena **)((long)pvVar8 + 0x3f8) = pPStack_a0;
    *(void **)((long)pvVar8 + 0x3c8) = pvVar8;
  }
  else {
    ((PromiseArenaMember *)local_c0._0_8_)->arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_c0._0_8_ + -0x40);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)local_c0,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++:1079:34)>
               ::anon_class_32_2_dc087ca5_for_func::operator());
    ((PromiseArenaMember *)(uVar3 + -0x40))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_006be710;
    pvVar2 = ((ClientHook *)((long)stack0xffffffffffffff48 + -0x20))->brand;
    pp_Var4 = *(_func_int ***)((long)&uStack_b0 + (long)pvVar2);
    ((PromiseArenaMember *)(uVar3 + -0x20))->arena = *(PromiseArena **)(local_c0 + (long)pvVar2 + 8)
    ;
    ((PromiseArenaMember *)(uVar3 + -0x10))->_vptr_PromiseArenaMember = pp_Var4;
    *(undefined8 *)((long)&uStack_b0 + (long)pvVar2) = 0;
    ((PromiseArenaMember *)(uVar3 + -0x20))->_vptr_PromiseArenaMember =
         (_func_int **)&Capability::Client::typeinfo;
    ((PromiseArenaMember *)(uVar3 + -0x10))->arena = pPStack_a0;
    ((PromiseArenaMember *)(uVar3 + -0x40))->arena = pPVar1;
  }
  local_78.segment = (SegmentReader *)&DAT_004ddfe0;
  local_78.capTable = (CapTableReader *)&DAT_004de03f;
  local_78.pointer = (WirePointer *)0x4c0000058b;
  local_80.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)this,&local_80,(SourceLocation *)&local_78);
  node.ptr = local_80.ptr;
  if ((TransformPromiseNodeBase *)local_80.ptr != (TransformPromiseNodeBase *)0x0) {
    local_80.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  pWVar5 = local_a8;
  if (local_a8 != (WirePointer *)0x0) {
    local_a8 = (WirePointer *)0x0;
    (*(code *)*uStack_b0->_vptr_CapTableReader)
              (uStack_b0,(long)&(pWVar5->offsetAndKind).value + *(long *)((long)*pWVar5 + -0x10));
  }
  uVar3 = local_c0._0_8_;
  if ((PromiseArenaMember *)local_c0._0_8_ != (PromiseArenaMember *)0x0) {
    local_c0._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  pCVar6 = pCStack_88;
  if (pCStack_88 != (CapTableReader *)0x0) {
    pCStack_88 = (CapTableReader *)0x0;
    (*(code *)local_90->arena->_vptr_Arena)
              (local_90,pCVar6->_vptr_CapTableReader[-2] + (long)&pCVar6->_vptr_CapTableReader);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::callFooWhenResolved(CallFooWhenResolvedContext context) {
  ++callCount;

  auto params = context.getParams();
  auto cap = params.getCap();

  return cap.whenResolved().then([KJ_CPCAP(cap),KJ_CPCAP(context)]() mutable {
    auto request = cap.fooRequest();
    request.setI(123);
    request.setJ(true);

    return request.send().then(
        [KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
          EXPECT_EQ("foo", response.getX());
          context.getResults().setS("bar");
        }